

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

Amount __thiscall cfd::Psbt::GetFeeAmount(Psbt *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RDI;
  Amount AVar3;
  Amount AVar4;
  size_t index_1;
  Amount total_output;
  uint32_t vout;
  size_t index;
  Amount total_input;
  wally_psbt *psbt_pointer;
  string *in_stack_fffffffffffffeb0;
  string *message;
  undefined8 in_stack_fffffffffffffeb8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffec0;
  char *this_00;
  ulong local_108;
  Amount local_100;
  undefined1 local_ea;
  undefined1 local_e9 [33];
  CfdSourceLocation local_c8;
  int64_t local_b0;
  undefined1 in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  uint local_4c;
  int64_t local_48;
  undefined1 local_40;
  ulong local_38;
  Amount local_30;
  long local_20;
  Amount local_10;
  
  bVar1 = HasAllUtxos((Psbt *)CONCAT71(in_stack_ffffffffffffff59,in_stack_ffffffffffffff58));
  if (bVar1) {
    local_20 = *(long *)(in_RDI + 8);
    core::Amount::Amount(&local_30);
    for (local_38 = 0; error_code = (CfdError)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
        local_38 < *(ulong *)(local_20 + 0x18); local_38 = local_38 + 1) {
      if (*(long *)(*(long *)(local_20 + 0x10) + local_38 * 0x110 + 8) == 0) {
        if (*(long *)(*(long *)(local_20 + 0x10) + local_38 * 0x110) == 0) {
          local_c8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_psbt.cpp"
                       ,0x2f);
          local_c8.filename = local_c8.filename + 1;
          local_c8.line = 0x113;
          local_c8.funcname = "GetFeeAmount";
          core::logger::warn<>(&local_c8,"psbt txin utxo is empty.");
          local_ea = 1;
          uVar2 = __cxa_allocate_exception(0x30);
          message = (string *)local_e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_e9 + 1),"psbt txin utxo is empty.",(allocator *)message);
          core::CfdException::CfdException(in_stack_fffffffffffffec0,error_code,message);
          local_ea = 0;
          __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        local_4c = *(uint *)(*(long *)(*(long *)(local_20 + 8) + 8) + local_38 * 0xd0 + 0x20);
        if (*(ulong *)(*(long *)(*(long *)(local_20 + 0x10) + local_38 * 0x110) + 0x28) <=
            (ulong)local_4c) {
          local_68.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_psbt.cpp"
                       ,0x2f);
          local_68.filename = local_68.filename + 1;
          local_68.line = 0x10d;
          local_68.funcname = "GetFeeAmount";
          this_00 = "psbt txin vout is invalid.";
          core::logger::warn<>(&local_68,"psbt txin vout is invalid.");
          uVar2 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_88,this_00,&local_89);
          core::CfdException::CfdException
                    ((CfdException *)this_00,(CfdError)((ulong)uVar2 >> 0x20),
                     in_stack_fffffffffffffeb0);
          __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        AVar3 = core::Amount::operator+=
                          (&local_30,
                           *(int64_t *)
                            (*(long *)(*(long *)(*(long *)(local_20 + 0x10) + local_38 * 0x110) +
                                      0x20) + (ulong)local_4c * 0x70));
        local_b0 = AVar3.amount_;
      }
      else {
        AVar3 = core::Amount::operator+=
                          (&local_30,
                           **(int64_t **)(*(long *)(local_20 + 0x10) + local_38 * 0x110 + 8));
        local_48 = AVar3.amount_;
        local_40 = AVar3.ignore_check_;
      }
    }
    core::Amount::Amount(&local_100);
    for (local_108 = 0; local_108 < *(ulong *)(*(long *)(local_20 + 8) + 0x28);
        local_108 = local_108 + 1) {
      core::Amount::operator+=
                (&local_100,
                 *(int64_t *)(*(long *)(*(long *)(local_20 + 8) + 0x20) + local_108 * 0x70));
    }
    bVar1 = core::operator<=(&local_30,&local_100);
    if (bVar1) {
      core::Amount::Amount(&local_10);
      AVar3._8_8_ = extraout_RDX_00;
      AVar3.amount_ = local_10.amount_;
    }
    else {
      AVar3 = core::operator-(&local_30,&local_100);
      local_10.ignore_check_ = AVar3.ignore_check_;
    }
  }
  else {
    core::Amount::Amount(&local_10);
    AVar3._8_8_ = extraout_RDX;
    AVar3.amount_ = local_10.amount_;
  }
  local_10.amount_ = AVar3.amount_;
  AVar4._9_7_ = AVar3._9_7_;
  AVar4.ignore_check_ = local_10.ignore_check_;
  AVar4.amount_ = local_10.amount_;
  return AVar4;
}

Assistant:

Amount Psbt::GetFeeAmount() const {
  if (!HasAllUtxos()) return Amount();
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);

  Amount total_input;
  for (size_t index = 0; index < psbt_pointer->num_inputs; ++index) {
    if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
      total_input += psbt_pointer->inputs[index].witness_utxo->satoshi;
    } else if (psbt_pointer->inputs[index].utxo != nullptr) {
      uint32_t vout = psbt_pointer->tx->inputs[index].index;
      if (psbt_pointer->inputs[index].utxo->num_outputs <= vout) {
        warn(CFD_LOG_SOURCE, "psbt txin vout is invalid.");
        throw CfdException(
            CfdError::kCfdIllegalStateError, "psbt txin vout is invalid.");
      }
      total_input += psbt_pointer->inputs[index].utxo->outputs[vout].satoshi;
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin utxo is empty.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "psbt txin utxo is empty.");
    }
  }

  Amount total_output;
  for (size_t index = 0; index < psbt_pointer->tx->num_outputs; ++index) {
    total_output += psbt_pointer->tx->outputs[index].satoshi;
  }

  if (total_input <= total_output) return Amount();
  return total_input - total_output;
}